

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O0

int __thiscall zmq::ipc_listener_t::set_local_address(ipc_listener_t *this,char *addr_)

{
  int iVar1;
  fd_t fVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  int *piVar6;
  socket_base_t *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ipc_listener_t *in_RDI;
  int err;
  int tmp_errno_1;
  int tmp_errno;
  int rc;
  ipc_address_t address;
  string addr;
  char *in_stack_fffffffffffffe90;
  socklen_t in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  socket_base_t *in_stack_fffffffffffffea0;
  allocator<char> *in_stack_fffffffffffffec0;
  string *endpoint_;
  string *in_stack_ffffffffffffff20;
  ipc_address_t *in_stack_ffffffffffffff28;
  ipc_address_t local_c4;
  undefined4 local_50;
  allocator<char> local_39;
  string local_38 [24];
  string *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path_;
  int local_4;
  
  endpoint_ = (string *)&local_39;
  path_ = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)in_RDI,in_stack_fffffffffffffec0);
  std::allocator<char>::~allocator(&local_39);
  if ((((in_RDI->super_stream_listener_base_t).super_own_t.options.use_fd == -1) &&
      (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar4 == '*')) &&
     (iVar1 = create_ipc_wildcard_address(path_,in_stack_ffffffffffffffe0), iVar1 < 0)) {
    local_4 = -1;
    local_50 = 1;
    goto LAB_002f7735;
  }
  if ((in_RDI->super_stream_listener_base_t).super_own_t.options.use_fd == -1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    unlink(pcVar4);
  }
  std::__cxx11::string::clear();
  ipc_address_t::ipc_address_t((ipc_address_t *)0x2f73e9);
  std::__cxx11::string::c_str();
  iVar1 = ipc_address_t::resolve
                    ((ipc_address_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     in_stack_fffffffffffffe90);
  if (iVar1 == 0) {
    ipc_address_t::to_string(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    if ((in_RDI->super_stream_listener_base_t).super_own_t.options.use_fd == -1) {
      fVar2 = open_socket((int)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                          in_stack_fffffffffffffe98);
      (in_RDI->super_stream_listener_base_t)._s = fVar2;
      if ((in_RDI->super_stream_listener_base_t)._s == -1) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          piVar6 = __errno_location();
          iVar1 = *piVar6;
          pcVar4 = (char *)std::__cxx11::string::c_str();
          rmdir(pcVar4);
          std::__cxx11::string::clear();
          piVar6 = __errno_location();
          *piVar6 = iVar1;
        }
        local_4 = -1;
      }
      else {
        in_stack_fffffffffffffe9c = (in_RDI->super_stream_listener_base_t)._s;
        psVar7 = (socket_base_t *)ipc_address_t::addr(&local_c4);
        in_stack_fffffffffffffe98 = ipc_address_t::addrlen(&local_c4);
        in_stack_fffffffffffffea0 = psVar7;
        iVar3 = bind(in_stack_fffffffffffffe9c,(sockaddr *)psVar7,in_stack_fffffffffffffe98);
        iVar1 = (int)psVar7;
        if (iVar3 == 0) {
          iVar1 = (in_RDI->super_stream_listener_base_t).super_own_t.options.backlog;
          iVar3 = listen((in_RDI->super_stream_listener_base_t)._s,iVar1);
          if (iVar3 == 0) goto LAB_002f7635;
        }
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        close(in_RDI,iVar1);
        piVar6 = __errno_location();
        *piVar6 = iVar3;
        local_4 = -1;
      }
    }
    else {
      (in_RDI->super_stream_listener_base_t)._s =
           (in_RDI->super_stream_listener_base_t).super_own_t.options.use_fd;
LAB_002f7635:
      std::__cxx11::string::operator=((string *)&in_RDI->_filename,local_38);
      in_RDI->_has_file = true;
      psVar7 = (in_RDI->super_stream_listener_base_t)._socket;
      make_unconnected_bind_endpoint_pair(endpoint_);
      socket_base_t::event_listening
                (in_stack_fffffffffffffea0,
                 (endpoint_uri_pair_t *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (fd_t)((ulong)psVar7 >> 0x20));
      endpoint_uri_pair_t::~endpoint_uri_pair_t((endpoint_uri_pair_t *)psVar7);
      local_4 = 0;
    }
  }
  else {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      piVar6 = __errno_location();
      iVar1 = *piVar6;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      rmdir(pcVar4);
      std::__cxx11::string::clear();
      piVar6 = __errno_location();
      *piVar6 = iVar1;
    }
    local_4 = -1;
  }
  local_50 = 1;
  ipc_address_t::~ipc_address_t(&local_c4);
LAB_002f7735:
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

int zmq::ipc_listener_t::set_local_address (const char *addr_)
{
    //  Create addr on stack for auto-cleanup
    std::string addr (addr_);

    //  Allow wildcard file
    if (options.use_fd == -1 && addr[0] == '*') {
        if (create_ipc_wildcard_address (_tmp_socket_dirname, addr) < 0) {
            return -1;
        }
    }

    //  Get rid of the file associated with the UNIX domain socket that
    //  may have been left behind by the previous run of the application.
    //  MUST NOT unlink if the FD is managed by the user, or it will stop
    //  working after the first client connects. The user will take care of
    //  cleaning up the file after the service is stopped.
    if (options.use_fd == -1) {
        ::unlink (addr.c_str ());
    }
    _filename.clear ();

    //  Initialise the address structure.
    ipc_address_t address;
    int rc = address.resolve (addr.c_str ());
    if (rc != 0) {
        if (!_tmp_socket_dirname.empty ()) {
            // We need to preserve errno to return to the user
            const int tmp_errno = errno;
            ::rmdir (_tmp_socket_dirname.c_str ());
            _tmp_socket_dirname.clear ();
            errno = tmp_errno;
        }
        return -1;
    }

    address.to_string (_endpoint);

    if (options.use_fd != -1) {
        _s = options.use_fd;
    } else {
        //  Create a listening socket.
        _s = open_socket (AF_UNIX, SOCK_STREAM, 0);
        if (_s == retired_fd) {
            if (!_tmp_socket_dirname.empty ()) {
                // We need to preserve errno to return to the user
                const int tmp_errno = errno;
                ::rmdir (_tmp_socket_dirname.c_str ());
                _tmp_socket_dirname.clear ();
                errno = tmp_errno;
            }
            return -1;
        }

        //  Bind the socket to the file path.
        rc = bind (_s, const_cast<sockaddr *> (address.addr ()),
                   address.addrlen ());
        if (rc != 0)
            goto error;

        //  Listen for incoming connections.
        rc = listen (_s, options.backlog);
        if (rc != 0)
            goto error;
    }

    _filename = ZMQ_MOVE (addr);
    _has_file = true;

    _socket->event_listening (make_unconnected_bind_endpoint_pair (_endpoint),
                              _s);
    return 0;

error:
    const int err = errno;
    close ();
    errno = err;
    return -1;
}